

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSwap
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  ulong uVar2;
  FieldGenerator *pFVar3;
  Descriptor *pDVar4;
  uint uVar5;
  char *text;
  long lVar6;
  int i;
  long lVar7;
  string local_50;
  
  io::Printer::Print(printer,"void $classname$::Swap($classname$* other) {\n","classname",
                     &this->classname_);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"if (other != this) {\n");
  io::Printer::Indent(printer);
  pDVar4 = this->descriptor_;
  if (*(int *)(*(long *)(*(long *)(pDVar4 + 0x10) + 0x88) + 0x50) == 2) {
    text = "GetReflection()->Swap(this, other);";
  }
  else {
    lVar6 = 0;
    for (lVar7 = 0; uVar2 = (ulong)*(int *)(pDVar4 + 0x2c), lVar7 < (long)uVar2; lVar7 = lVar7 + 1)
    {
      pFVar3 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(pDVar4 + 0x30) + lVar6));
      (*pFVar3->_vptr_FieldGenerator[8])(pFVar3,printer);
      pDVar4 = this->descriptor_;
      lVar6 = lVar6 + 0x78;
    }
    uVar5 = 0;
    while( true ) {
      iVar1 = (int)uVar2 + 0x1f;
      if (iVar1 / 0x20 <= (int)uVar5) break;
      SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)uVar5,iVar1 % 0x20);
      io::Printer::Print(printer,"std::swap(_has_bits_[$i$], other->_has_bits_[$i$]);\n","i",
                         &local_50);
      std::__cxx11::string::~string((string *)&local_50);
      uVar5 = uVar5 + 1;
      pDVar4 = this->descriptor_;
      uVar2 = (ulong)*(uint *)(pDVar4 + 0x2c);
    }
    if (*(int *)(*(long *)(*(long *)(pDVar4 + 0x10) + 0x88) + 0x50) != 3) {
      io::Printer::Print(printer,"_unknown_fields_.Swap(&other->_unknown_fields_);\n");
    }
    io::Printer::Print(printer,"std::swap(_cached_size_, other->_cached_size_);\n");
    if (*(int *)(this->descriptor_ + 0x58) < 1) goto LAB_001b51b5;
    text = "_extensions_.Swap(&other->_extensions_);\n";
  }
  io::Printer::Print(printer,text);
LAB_001b51b5:
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateSwap(io::Printer* printer) {
  // Generate the Swap member function.
  printer->Print("void $classname$::Swap($classname$* other) {\n",
                 "classname", classname_);
  printer->Indent();
  printer->Print("if (other != this) {\n");
  printer->Indent();

  if (HasGeneratedMethods(descriptor_->file())) {
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      field_generators_.get(field).GenerateSwappingCode(printer);
    }

    for (int i = 0; i < (descriptor_->field_count() + 31) / 32; ++i) {
      printer->Print("std::swap(_has_bits_[$i$], other->_has_bits_[$i$]);\n",
                     "i", SimpleItoa(i));
    }

    if (HasUnknownFields(descriptor_->file())) {
      printer->Print("_unknown_fields_.Swap(&other->_unknown_fields_);\n");
    }
    printer->Print("std::swap(_cached_size_, other->_cached_size_);\n");
    if (descriptor_->extension_range_count() > 0) {
      printer->Print("_extensions_.Swap(&other->_extensions_);\n");
    }
  } else {
    printer->Print("GetReflection()->Swap(this, other);");
  }

  printer->Outdent();
  printer->Print("}\n");
  printer->Outdent();
  printer->Print("}\n");
}